

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

bool __thiscall
vkb::PhysicalDevice::is_features_node_present(PhysicalDevice *this,GenericFeaturesPNextNode *node)

{
  bool bVar1;
  GenericFeatureChain requested_features;
  GenericFeatureChain local_28;
  
  local_28.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,std::allocator<vkb::detail::GenericFeaturesPNextNode>>
  ::_M_realloc_insert<vkb::detail::GenericFeaturesPNextNode_const&>
            ((vector<vkb::detail::GenericFeaturesPNextNode,std::allocator<vkb::detail::GenericFeaturesPNextNode>>
              *)&local_28,(iterator)0x0,node);
  bVar1 = detail::GenericFeatureChain::find_and_match(&this->extended_features_chain,&local_28);
  if (local_28.nodes.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.nodes.
                    super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool PhysicalDevice::is_features_node_present(detail::GenericFeaturesPNextNode const& node) const {
    detail::GenericFeatureChain requested_features;
    requested_features.nodes.push_back(node);

    return extended_features_chain.find_and_match(requested_features);
}